

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O1

void libyuv::ScalePlaneSimple
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint8_t *src_ptr,uint8_t *dst_ptr)

{
  int iVar1;
  code *pcVar2;
  code *pcVar3;
  long lVar4;
  int y;
  int local_40;
  int dy;
  int dx;
  int x;
  
  x = 0;
  y = 0;
  dx = 0;
  dy = 0;
  local_40 = dst_stride;
  ScaleSlope(src_width,src_height,dst_width,dst_height,kFilterNone,&x,&y,&dx,&dy);
  iVar1 = -src_width;
  if (0 < src_width) {
    iVar1 = src_width;
  }
  pcVar2 = ScaleCols_C;
  if (x < 0x8000) {
    pcVar2 = ScaleColsUp2_C;
  }
  pcVar3 = ScaleCols_C;
  if (iVar1 * 2 == dst_width) {
    pcVar3 = pcVar2;
  }
  if (0 < dst_height) {
    lVar4 = (long)local_40;
    do {
      (*pcVar3)(dst_ptr,src_ptr + y._2_2_ * src_stride,dst_width,x,dx);
      dst_ptr = dst_ptr + lVar4;
      y = y + dy;
      dst_height = dst_height + -1;
    } while (dst_height != 0);
  }
  return;
}

Assistant:

static void ScalePlaneSimple(int src_width,
                             int src_height,
                             int dst_width,
                             int dst_height,
                             int src_stride,
                             int dst_stride,
                             const uint8_t* src_ptr,
                             uint8_t* dst_ptr) {
  int i;
  void (*ScaleCols)(uint8_t * dst_ptr, const uint8_t* src_ptr, int dst_width,
                    int x, int dx) = ScaleCols_C;
  // Initial source x/y coordinate and step values as 16.16 fixed point.
  int x = 0;
  int y = 0;
  int dx = 0;
  int dy = 0;
  ScaleSlope(src_width, src_height, dst_width, dst_height, kFilterNone, &x, &y,
             &dx, &dy);
  src_width = Abs(src_width);

  if (src_width * 2 == dst_width && x < 0x8000) {
    ScaleCols = ScaleColsUp2_C;
#if defined(HAS_SCALECOLS_SSE2)
    if (TestCpuFlag(kCpuHasSSE2) && IS_ALIGNED(dst_width, 8)) {
      ScaleCols = ScaleColsUp2_SSE2;
    }
#endif
#if defined(HAS_SCALECOLS_MMI)
    if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(dst_width, 8)) {
      ScaleCols = ScaleColsUp2_MMI;
    }
#endif
  }

  for (i = 0; i < dst_height; ++i) {
    ScaleCols(dst_ptr, src_ptr + (y >> 16) * src_stride, dst_width, x, dx);
    dst_ptr += dst_stride;
    y += dy;
  }
}